

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertStrUtil.cpp
# Opt level: O2

string * lzstring::to_string(string *__return_storage_ptr__,wstring *src)

{
  size_t sVar1;
  vector<char,_std::allocator<char>_> tmp;
  allocator_type local_29;
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  setlocale(0,"");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = wcstombs((char *)0x0,(src->_M_dataplus)._M_p,0);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_28,sVar1 + 1,&local_29);
  wcstombs(local_28._M_impl.super__Vector_impl_data._M_start,(src->_M_dataplus)._M_p,
           (long)local_28._M_impl.super__Vector_impl_data._M_finish -
           (long)local_28._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::
  assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)__return_storage_ptr__,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             local_28._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (local_28._M_impl.super__Vector_impl_data._M_finish + -1));
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(std::wstring const &src)
{
    std::setlocale(LC_CTYPE, "");

    std::string dest;
    size_t const mbs_len = wcstombs(NULL, src.c_str(), 0);
    std::vector<char> tmp(mbs_len + 1);
    wcstombs(&tmp[0], src.c_str(), tmp.size());

    dest.assign(tmp.begin(), tmp.end() - 1);

    return dest;
}